

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O2

QAsn1Element * QAsn1Element::fromInteger(QAsn1Element *__return_storage_ptr__,uint val)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)__return_storage_ptr__ = 0xaaaaaaaaaaaaaaaa;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char *)0x0;
  local_38.size = 0;
  __return_storage_ptr__->mType = '\x02';
  (__return_storage_ptr__->mValue).d.d = (Data *)0x0;
  (__return_storage_ptr__->mValue).d.ptr = (char *)0x0;
  (__return_storage_ptr__->mValue).d.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  while( true ) {
    QByteArray::prepend(&__return_storage_ptr__->mValue,(char)val);
    if (val < 0x80) break;
    val = val >> 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QAsn1Element QAsn1Element::fromInteger(unsigned int val)
{
    QAsn1Element elem(QAsn1Element::IntegerType);
    while (val > 127) {
        elem.mValue.prepend(val & 0xff);
        val >>= 8;
    }
    elem.mValue.prepend(val & 0x7f);
    return elem;
}